

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O0

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateE
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3<int> *pVVar5;
  double dVar6;
  YeeGrid<(pica::Dimension)3,_double> *pYVar7;
  ValueType *pVVar8;
  void *in_RSI;
  Grid<(pica::Dimension)3,_double> *in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  IndexType IVar11;
  Vector3<int> VVar12;
  int k_2;
  int j_2;
  int k_1;
  int i_2;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  IndexType end;
  IndexType begin;
  PositionType coeff;
  ValueType cdt;
  ValueType coeffCurrent;
  Vector3<double> *in_stack_fffffffffffffd78;
  Vector3<double> *in_stack_fffffffffffffd80;
  int k_00;
  Vector3<int> *in_stack_fffffffffffffd88;
  Grid<(pica::Dimension)3,_double> *in_stack_fffffffffffffd90;
  YeeGrid<(pica::Dimension)3,_double> *pYVar13;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  undefined8 local_c0;
  int local_b8;
  Vector3<int> local_ac;
  IndexType local_a0;
  undefined8 local_90;
  int local_88;
  undefined8 local_80;
  int local_78;
  Vector3<int> local_74;
  PositionType local_68;
  Vector3<double> local_50;
  double local_38;
  Vector3<int> *local_30;
  double local_28;
  double local_20;
  YeeGrid<(pica::Dimension)3,_double> *local_18;
  double local_10;
  Grid<(pica::Dimension)3,_double> *local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  dVar9 = Constants<double>::pi();
  local_18 = (YeeGrid<(pica::Dimension)3,_double> *)(dVar9 * -4.0 * local_10);
  Constants<double>::c(in_RDI,in_RSI);
  local_20 = extraout_XMM0_Qa * local_10;
  Vector3<double>::Vector3(&local_50,local_20,local_20,local_20);
  Grid<(pica::Dimension)3,_double>::getStep(&local_68,local_8);
  operator/(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  Vector3<int>::Vector3(&local_74,0,0,0);
  IVar11 = Grid<(pica::Dimension)3,_double>::getSize(in_stack_fffffffffffffd90);
  local_a0.z = IVar11.z;
  local_88 = local_a0.z;
  local_a0._0_8_ = IVar11._0_8_;
  local_90._0_4_ = local_a0.x;
  local_90._4_4_ = local_a0.y;
  local_a0 = IVar11;
  Vector3<int>::Vector3(&local_ac,1,1,1);
  VVar12 = pica::operator-((Vector3<int> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_c0 = VVar12._0_8_;
  local_80 = local_c0;
  local_b8 = VVar12.z;
  local_78 = local_b8;
  for (local_c4 = local_74.x; local_c4 < (int)local_80; local_c4 = local_c4 + 1) {
    for (local_c8 = local_74.y; local_c8 < local_80._4_4_; local_c8 = local_c8 + 1) {
      for (local_cc = local_74.z; pYVar13 = local_18, local_cc < local_78; local_cc = local_cc + 1)
      {
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pVVar5 = local_30;
        dVar9 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar4 = local_28;
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar10 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pYVar7 = local_18;
        *pVVar8 = -dVar4 * (dVar3 - dVar10) +
                  (double)pYVar13 * dVar9 + (double)pVVar5 * (dVar1 - dVar2) + *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jy
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar6 = local_28;
        dVar9 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar4 = local_38;
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar10 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pYVar13 = local_18;
        *pVVar8 = -dVar4 * (dVar3 - dVar10) + (double)pYVar7 * dVar9 + dVar6 * (dVar1 - dVar2) +
                  *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar4 = local_38;
        dVar9 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pVVar5 = local_30;
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        dVar10 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                            (int)in_stack_fffffffffffffd88,
                            (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        *pVVar8 = -(double)pVVar5 * (dVar3 - dVar10) +
                  (double)pYVar13 * dVar9 + dVar4 * (dVar1 - dVar2) + *pVVar8;
      }
    }
  }
  for (local_d0 = local_74.x; local_d0 < (int)local_80; local_d0 = local_d0 + 1) {
    for (local_d4 = local_74.y; pYVar13 = local_18, local_d4 < local_80._4_4_;
        local_d4 = local_d4 + 1) {
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jz
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar4 = local_38;
      dVar9 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      pVVar5 = local_30;
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar3 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar10 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      *pVVar8 = -(double)pVVar5 * (dVar3 - dVar10) +
                (double)pYVar13 * dVar9 + dVar4 * (dVar1 - dVar2) + *pVVar8;
    }
  }
  for (local_d8 = local_74.x; local_d8 < (int)local_80; local_d8 = local_d8 + 1) {
    for (local_dc = local_74.z; pYVar13 = local_18, local_dc < local_78; local_dc = local_dc + 1) {
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jy
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar6 = local_28;
      dVar9 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar4 = local_38;
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar3 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar10 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      *pVVar8 = -dVar4 * (dVar3 - dVar10) + (double)pYVar13 * dVar9 + dVar6 * (dVar1 - dVar2) +
                *pVVar8;
    }
  }
  for (local_e0 = local_74.y; local_e0 < local_80._4_4_; local_e0 = local_e0 + 1) {
    for (local_e4 = local_74.z; k_00 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
        local_e4 < local_78; local_e4 = local_e4 + 1) {
      pYVar13 = local_18;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::jx
                         (local_18,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,k_00);
      dVar9 = *pVVar8;
      in_stack_fffffffffffffd88 = local_30;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                         (pYVar13,(int)((ulong)local_30 >> 0x20),(int)local_30,k_00);
      in_stack_fffffffffffffd80 = (Vector3<double> *)*pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz
                         (pYVar13,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar3 = local_28;
      dVar10 = (double)in_stack_fffffffffffffd88 * ((double)in_stack_fffffffffffffd80 - *pVVar8);
      dVar9 = (double)pYVar13 * dVar9;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                         (pYVar13,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by
                         (pYVar13,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex
                         (pYVar13,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                          (int)in_stack_fffffffffffffd88,
                          (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      *pVVar8 = -dVar3 * (dVar1 - dVar2) + dVar9 + dVar10 + *pVVar8;
    }
  }
  return;
}

Assistant:

static void updateE(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        const ValueType coeffCurrent = -static_cast<ValueType>(4) * Constants<ValueType>::pi() * dt;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(0, 0, 0);
        const IndexType end = grid.getSize() - IndexType(1, 1, 1);
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.ex(i, j, k) += coeffCurrent * grid.jx(i, j, k) +
                coeff.y * (grid.bz(i, j + 1, k) - grid.bz(i, j, k)) -
                coeff.z * (grid.by(i, j, k + 1) - grid.by(i, j, k));
            grid.ey(i, j, k) += coeffCurrent * grid.jy(i, j, k) +
                coeff.z * (grid.bx(i, j, k + 1) - grid.bx(i, j, k)) -
                coeff.x * (grid.bz(i + 1, j, k) - grid.bz(i, j, k));
            grid.ez(i, j, k) += coeffCurrent * grid.jz(i, j, k) +
                coeff.x * (grid.by(i + 1, j, k) - grid.by(i, j, k)) -
                coeff.y * (grid.bx(i, j + 1, k) - grid.bx(i, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.ez(i, j, end.z) += coeffCurrent * grid.jz(i, j, end.z) +
                coeff.x * (grid.by(i + 1, j, end.z) - grid.by(i, j, end.z)) -
                coeff.y * (grid.bx(i, j + 1, end.z) - grid.bx(i, j, end.z));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.ey(i, end.y, k) += coeffCurrent * grid.jy(i, end.y, k) +
                coeff.z * (grid.bx(i, end.y, k + 1) - grid.bx(i, end.y, k)) -
                coeff.x * (grid.bz(i + 1, end.y, k) - grid.bz(i, end.y, k));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.ex(end.x, j, k) += coeffCurrent * grid.jx(end.x, j, k) +
                coeff.y * (grid.bz(end.x, j + 1, k) - grid.bz(end.x, j, k)) -
                coeff.z * (grid.by(end.x, j, k + 1) - grid.by(end.x, j, k));
    }